

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  ImGuiStoragePair *pIVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  ImGuiColumns *pIVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  uVar10 = 1;
  if (window->Active == false) {
    uVar10 = (ulong)window->WasActive;
  }
  bVar6 = TreeNode(label,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar10,window);
  bVar7 = IsItemHovered(0);
  pcVar9 = extraout_RDX;
  if ((bVar7) && (window->WasActive == true)) {
    local_38.x = (window->Size).x + (window->Pos).x;
    local_38.y = (window->Size).y + (window->Pos).y;
    ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0);
    pcVar9 = extraout_RDX_00;
  }
  if (bVar6) {
    if (window->WasActive == false) {
      TextDisabled("Note: window is not currently visible.");
      pcVar9 = extraout_RDX_01;
    }
    if (window->MemoryCompacted == true) {
      TextDisabled("Note: some memory buffers have been compacted/freed.");
      pcVar9 = extraout_RDX_02;
    }
    uVar4 = window->Flags;
    NodeDrawList(window,window->DrawList,pcVar9);
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->ContentSize).x,
               (double)(window->ContentSize).y);
    pcVar9 = "Child ";
    if ((uVar4 >> 0x18 & 1) == 0) {
      pcVar9 = "";
    }
    auVar23._0_4_ = -(uint)((uVar4 & 0x10000000) == 0);
    auVar23._4_4_ = -(uint)((uVar4 & 0x8000000) == 0);
    auVar23._8_4_ = -(uint)((uVar4 & 0x4000000) == 0);
    auVar23._12_4_ = -(uint)((uVar4 & 0x2000000) == 0);
    auVar22._0_4_ = -(uint)((uVar4 & 0x40) == 0);
    auVar22._4_4_ = -(uint)((uVar4 & 0x40000) == 0);
    auVar22._8_4_ = -(uint)((uVar4 & 0x200) == 0);
    auVar22._12_4_ = -(uint)((uVar4 & 0x100) == 0);
    auVar23 = packssdw(auVar22,auVar23);
    auVar23 = packsswb(auVar23,auVar23);
    pcVar8 = "Tooltip ";
    if ((auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar8 = "";
    }
    pcVar11 = "Popup ";
    if ((auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar11 = "";
    }
    pcVar12 = "Modal ";
    if ((auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar12 = "";
    }
    pcVar13 = "ChildMenu ";
    if ((auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar13 = "";
    }
    pcVar14 = "NoSavedSettings ";
    if ((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar14 = "";
    }
    pcVar19 = "NoMouseInputs";
    if ((auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar19 = "";
    }
    pcVar15 = "NoNavInputs";
    if ((auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar15 = "";
    }
    pcVar16 = "AlwaysAutoResize";
    if ((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar16 = "";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar4,pcVar9,pcVar8,pcVar11,pcVar12,
               pcVar13,pcVar14,pcVar19,pcVar15,pcVar16);
    pcVar9 = "X";
    if (window->ScrollbarX == false) {
      pcVar9 = "";
    }
    pcVar8 = "Y";
    if (window->ScrollbarY == false) {
      pcVar8 = "";
    }
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
               (double)(window->ScrollMax).x,(double)(window->Scroll).y,
               (double)(window->ScrollMax).y,pcVar9,pcVar8);
    if ((window->Active != false) || (uVar10 = 0xffffffff, window->WasActive != false)) {
      uVar10 = (ulong)(uint)(int)window->BeginOrderWithinContext;
    }
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active
               ,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar10);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
               (ulong)window->Appearing,(ulong)window->Hidden,
               (ulong)(uint)window->HiddenFramesCanSkipItems,
               (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
               (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      pcVar9 = "NULL";
    }
    else {
      pcVar9 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLastChildNavWindow: %s",pcVar9);
    fVar3 = window->NavRectRel[0].Min.x;
    pIVar1 = &window->NavRectRel[0].Max;
    if ((pIVar1->x <= fVar3 && fVar3 != pIVar1->x) ||
       (fVar21 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
       *pfVar2 <= fVar21 && fVar21 != *pfVar2)) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar3,
                 (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                 (double)window->NavRectRel[0].Max.y);
    }
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      NodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    if ((0 < (window->ColumnsStorage).Size) &&
       (bVar6 = TreeNode("Columns","Columns sets (%d)"), bVar6)) {
      if (0 < (window->ColumnsStorage).Size) {
        lVar20 = 0;
        do {
          pIVar17 = (window->ColumnsStorage).Data;
          bVar6 = TreeNode((void *)(ulong)pIVar17[lVar20].ID,
                           "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                           (void *)(ulong)pIVar17[lVar20].ID,(ulong)(uint)pIVar17[lVar20].Count,
                           (ulong)(uint)pIVar17[lVar20].Flags);
          if (bVar6) {
            pIVar17 = pIVar17 + lVar20;
            BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                       (double)(pIVar17->OffMaxX - pIVar17->OffMinX),(double)pIVar17->OffMinX,
                       (double)pIVar17->OffMaxX);
            if (0 < (pIVar17->Columns).Size) {
              lVar18 = 0;
              uVar10 = 0;
              do {
                fVar3 = *(float *)((long)&((pIVar17->Columns).Data)->OffsetNorm + lVar18);
                fVar21 = GetColumnOffsetFromNorm(pIVar17,fVar3);
                BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar3,(double)fVar21,
                           uVar10 & 0xffffffff);
                uVar10 = uVar10 + 1;
                lVar18 = lVar18 + 0x1c;
              } while ((long)uVar10 < (long)(pIVar17->Columns).Size);
            }
            TreePop();
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (window->ColumnsStorage).Size);
      }
      TreePop();
    }
    uVar4 = (window->StateStorage).Data.Size;
    bVar6 = TreeNode("Storage","%s: %d entries, %d bytes","Storage",(ulong)uVar4,(ulong)(uVar4 << 4)
                    );
    if (bVar6) {
      if (0 < (window->StateStorage).Data.Size) {
        lVar18 = 8;
        lVar20 = 0;
        do {
          pIVar5 = (window->StateStorage).Data.Data;
          BulletText("Key 0x%08X Value { i: %d }",(ulong)*(uint *)((long)pIVar5 + lVar18 + -8),
                     (ulong)*(uint *)((long)&pIVar5->key + lVar18));
          lVar20 = lVar20 + 1;
          lVar18 = lVar18 + 0x10;
        } while (lVar20 < (window->StateStorage).Data.Size);
      }
      TreePop();
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (!window->WasActive)
                ImGui::TextDisabled("Note: window is not currently visible.");
            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }